

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_dr_mp3_L3_imdct36(float *grbuf,float *overlap,float *window,int nbands)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  long lVar26;
  float *pfVar27;
  int iVar28;
  float *pfVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float si [9];
  float co [9];
  float local_88 [12];
  float local_58 [8];
  float local_38;
  
  if (0 < nbands) {
    pfVar29 = grbuf + 0xe;
    iVar28 = 0;
    do {
      local_58[0] = -*grbuf;
      local_88[0] = grbuf[0x11];
      lVar26 = 4;
      pfVar27 = local_88 + 5;
      do {
        pfVar1 = (float *)((long)grbuf + lVar26 * 2 + -4);
        fVar2 = *pfVar1;
        fVar30 = pfVar1[1];
        fVar3 = pfVar1[2];
        fVar4 = pfVar1[3];
        pfVar1 = (float *)((long)grbuf + lVar26 * 2 + 0xc);
        fVar5 = *pfVar1;
        fVar6 = pfVar1[1];
        fVar7 = pfVar1[2];
        fVar8 = pfVar1[3];
        *pfVar27 = fVar8 - fVar7;
        pfVar27[1] = fVar5 - fVar6;
        pfVar27[2] = fVar4 - fVar3;
        pfVar27[3] = fVar2 - fVar30;
        *(float *)((long)local_58 + lVar26) = fVar30 + fVar2;
        *(float *)((long)local_58 + lVar26 + 4) = -(fVar4 + fVar3);
        *(float *)((long)local_58 + lVar26 + 8) = fVar6 + fVar5;
        *(float *)((long)local_58 + lVar26 + 0xc) = -(fVar8 + fVar7);
        lVar26 = lVar26 + 0x10;
        pfVar27 = pfVar27 + -4;
      } while (lVar26 != 0x24);
      ma_dr_mp3_L3_dct3_9(local_58);
      ma_dr_mp3_L3_dct3_9(local_88);
      local_88[1] = (float)((uint)local_88[1] ^ 0x80000000);
      local_88[3] = (float)((uint)local_88[3] ^ 0x80000000);
      local_88[5] = (float)((uint)local_88[5] ^ 0x80000000);
      local_88[7] = (float)((uint)local_88[7] ^ 0x80000000);
      lVar26 = 0;
      pfVar27 = pfVar29;
      do {
        pfVar1 = (float *)((long)overlap + lVar26);
        fVar2 = *pfVar1;
        fVar30 = pfVar1[1];
        fVar3 = pfVar1[2];
        fVar4 = pfVar1[3];
        fVar5 = *(float *)((long)local_58 + lVar26 + 4);
        fVar6 = *(float *)((long)local_58 + lVar26 + 8);
        fVar7 = *(float *)((long)local_58 + lVar26 + 0xc);
        fVar8 = *(float *)((long)local_88 + lVar26 + 4);
        fVar9 = *(float *)((long)local_88 + lVar26 + 8);
        fVar10 = *(float *)((long)local_88 + lVar26 + 0xc);
        fVar11 = *(float *)((long)ma_dr_mp3_L3_imdct36::g_twid9 + lVar26 + 4);
        fVar12 = *(float *)((long)ma_dr_mp3_L3_imdct36::g_twid9 + lVar26 + 8);
        fVar13 = *(float *)((long)ma_dr_mp3_L3_imdct36::g_twid9 + lVar26 + 0xc);
        fVar14 = *(float *)((long)ma_dr_mp3_L3_imdct36::g_twid9 + lVar26 + 0x24);
        fVar15 = *(float *)((long)ma_dr_mp3_L3_imdct36::g_twid9 + lVar26 + 0x28);
        fVar16 = *(float *)((long)ma_dr_mp3_L3_imdct36::g_twid9 + lVar26 + 0x2c);
        fVar17 = *(float *)((long)ma_dr_mp3_L3_imdct36::g_twid9 + lVar26 + 0x30);
        pfVar1 = (float *)((long)window + lVar26);
        fVar18 = *pfVar1;
        fVar19 = pfVar1[1];
        fVar20 = pfVar1[2];
        fVar21 = pfVar1[3];
        pfVar1 = (float *)((long)window + lVar26 + 0x24);
        fVar22 = *pfVar1;
        fVar23 = pfVar1[1];
        fVar24 = pfVar1[2];
        fVar25 = pfVar1[3];
        fVar31 = *(float *)((long)local_88 + lVar26) *
                 *(float *)((long)ma_dr_mp3_L3_imdct36::g_twid9 + lVar26) +
                 *(float *)((long)local_58 + lVar26) * fVar14;
        fVar32 = fVar8 * fVar11 + fVar5 * fVar15;
        fVar33 = fVar9 * fVar12 + fVar6 * fVar16;
        fVar34 = fVar10 * fVar13 + fVar7 * fVar17;
        pfVar1 = (float *)((long)overlap + lVar26);
        *pfVar1 = *(float *)((long)local_58 + lVar26) *
                  *(float *)((long)ma_dr_mp3_L3_imdct36::g_twid9 + lVar26) -
                  *(float *)((long)local_88 + lVar26) * fVar14;
        pfVar1[1] = fVar5 * fVar11 - fVar8 * fVar15;
        pfVar1[2] = fVar6 * fVar12 - fVar9 * fVar16;
        pfVar1[3] = fVar7 * fVar13 - fVar10 * fVar17;
        pfVar1 = (float *)((long)grbuf + lVar26);
        *pfVar1 = fVar2 * fVar18 - fVar31 * fVar22;
        pfVar1[1] = fVar30 * fVar19 - fVar32 * fVar23;
        pfVar1[2] = fVar3 * fVar20 - fVar33 * fVar24;
        pfVar1[3] = fVar4 * fVar21 - fVar34 * fVar25;
        *pfVar27 = fVar4 * fVar25 + fVar21 * fVar34;
        pfVar27[1] = fVar3 * fVar24 + fVar20 * fVar33;
        pfVar27[2] = fVar30 * fVar23 + fVar19 * fVar32;
        pfVar27[3] = fVar2 * fVar22 + fVar18 * fVar31;
        lVar26 = lVar26 + 0x10;
        pfVar27 = pfVar27 + -4;
      } while (lVar26 == 0x10);
      fVar2 = overlap[8];
      fVar30 = local_38 * 0.04361938 + local_88[8] * 0.99904823;
      overlap[8] = local_38 * 0.99904823 + local_88[8] * -0.04361938;
      grbuf[8] = window[8] * fVar2 - window[0x11] * fVar30;
      grbuf[9] = fVar2 * window[0x11] + fVar30 * window[8];
      iVar28 = iVar28 + 1;
      grbuf = grbuf + 0x12;
      overlap = overlap + 9;
      pfVar29 = pfVar29 + 0x12;
    } while (iVar28 != nbands);
  }
  return;
}

Assistant:

static void ma_dr_mp3_L3_imdct36(float *grbuf, float *overlap, const float *window, int nbands)
{
    int i, j;
    static const float g_twid9[18] = {
        0.73727734f,0.79335334f,0.84339145f,0.88701083f,0.92387953f,0.95371695f,0.97629601f,0.99144486f,0.99904822f,0.67559021f,0.60876143f,0.53729961f,0.46174861f,0.38268343f,0.30070580f,0.21643961f,0.13052619f,0.04361938f
    };
    for (j = 0; j < nbands; j++, grbuf += 18, overlap += 9)
    {
        float co[9], si[9];
        co[0] = -grbuf[0];
        si[0] = grbuf[17];
        for (i = 0; i < 4; i++)
        {
            si[8 - 2*i] =   grbuf[4*i + 1] - grbuf[4*i + 2];
            co[1 + 2*i] =   grbuf[4*i + 1] + grbuf[4*i + 2];
            si[7 - 2*i] =   grbuf[4*i + 4] - grbuf[4*i + 3];
            co[2 + 2*i] = -(grbuf[4*i + 3] + grbuf[4*i + 4]);
        }
        ma_dr_mp3_L3_dct3_9(co);
        ma_dr_mp3_L3_dct3_9(si);
        si[1] = -si[1];
        si[3] = -si[3];
        si[5] = -si[5];
        si[7] = -si[7];
        i = 0;
#if MA_DR_MP3_HAVE_SIMD
        if (ma_dr_mp3_have_simd()) for (; i < 8; i += 4)
        {
            ma_dr_mp3_f4 vovl = MA_DR_MP3_VLD(overlap + i);
            ma_dr_mp3_f4 vc = MA_DR_MP3_VLD(co + i);
            ma_dr_mp3_f4 vs = MA_DR_MP3_VLD(si + i);
            ma_dr_mp3_f4 vr0 = MA_DR_MP3_VLD(g_twid9 + i);
            ma_dr_mp3_f4 vr1 = MA_DR_MP3_VLD(g_twid9 + 9 + i);
            ma_dr_mp3_f4 vw0 = MA_DR_MP3_VLD(window + i);
            ma_dr_mp3_f4 vw1 = MA_DR_MP3_VLD(window + 9 + i);
            ma_dr_mp3_f4 vsum = MA_DR_MP3_VADD(MA_DR_MP3_VMUL(vc, vr1), MA_DR_MP3_VMUL(vs, vr0));
            MA_DR_MP3_VSTORE(overlap + i, MA_DR_MP3_VSUB(MA_DR_MP3_VMUL(vc, vr0), MA_DR_MP3_VMUL(vs, vr1)));
            MA_DR_MP3_VSTORE(grbuf + i, MA_DR_MP3_VSUB(MA_DR_MP3_VMUL(vovl, vw0), MA_DR_MP3_VMUL(vsum, vw1)));
            vsum = MA_DR_MP3_VADD(MA_DR_MP3_VMUL(vovl, vw1), MA_DR_MP3_VMUL(vsum, vw0));
            MA_DR_MP3_VSTORE(grbuf + 14 - i, MA_DR_MP3_VREV(vsum));
        }
#endif
        for (; i < 9; i++)
        {
            float ovl  = overlap[i];
            float sum  = co[i]*g_twid9[9 + i] + si[i]*g_twid9[0 + i];
            overlap[i] = co[i]*g_twid9[0 + i] - si[i]*g_twid9[9 + i];
            grbuf[i]      = ovl*window[0 + i] - sum*window[9 + i];
            grbuf[17 - i] = ovl*window[9 + i] + sum*window[0 + i];
        }
    }
}